

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_extract_component_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,uint32_t index)

{
  bool bVar1;
  char **in_R8;
  char (*in_R9) [2];
  uint32_t index_local;
  string expr;
  char *local_28;
  
  index_local = index;
  to_enclosed_expression_abi_cxx11_(&expr,this,id,true);
  bVar1 = Compiler::has_extended_decoration
                    (&this->super_Compiler,id,SPIRVCrossDecorationPhysicalTypePacked);
  if (bVar1) {
    join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2828da,
               (char (*) [2])&index_local,(uint *)0x2827df,in_R9);
  }
  else {
    if (index - 1 < 3) {
      local_28 = *(char **)(&DAT_00354150 + (ulong)(index - 1) * 8);
    }
    else {
      local_28 = "x";
    }
    join<std::__cxx11::string&,char_const(&)[2],char_const*>
              (__return_storage_ptr__,(spirv_cross *)&expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e361,
               (char (*) [2])&local_28,in_R8);
  }
  ::std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_extract_component_expression(uint32_t id, uint32_t index)
{
	auto expr = to_enclosed_expression(id);
	if (has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked))
		return join(expr, "[", index, "]");
	else
		return join(expr, ".", index_to_swizzle(index));
}